

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

void __thiscall
cmConditionEvaluator::cmArgumentList::ReduceTwoArgs
          (cmArgumentList *this,bool value,CurrentAndTwoMoreIter args)

{
  reference this_00;
  bool in_DL;
  const_iterator local_88;
  _List_node_base *local_80;
  const_iterator local_78 [3];
  string local_60;
  cmExpandedCommandArgument local_40;
  undefined1 local_11;
  cmArgumentList *pcStack_10;
  bool value_local;
  cmArgumentList *this_local;
  
  local_11 = value;
  pcStack_10 = this;
  (anonymous_namespace)::bool2string_abi_cxx11_
            (&local_60,(_anonymous_namespace_ *)(ulong)(value & 1),in_DL);
  cmExpandedCommandArgument::cmExpandedCommandArgument(&local_40,&local_60,true);
  this_00 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
  cmExpandedCommandArgument::operator=(this_00,&local_40);
  cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
            (local_78,&args.nextnext);
  local_80 = (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
                       (&this->
                         super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ,local_78[0]);
  std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator(&local_88,&args.next);
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
            (&this->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
             local_88);
  return;
}

Assistant:

void ReduceTwoArgs(const bool value, CurrentAndTwoMoreIter args)
  {
    *args.current = cmExpandedCommandArgument(bool2string(value), true);
    this->erase(args.nextnext);
    this->erase(args.next);
  }